

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  U32 *pUVar1;
  uint uVar2;
  uint uVar3;
  ldmEntry_t *plVar4;
  size_t sVar5;
  rawSeq *prVar6;
  bool bVar7;
  uint uVar8;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  int iVar12;
  BYTE *pBVar13;
  xxh_u64 xVar14;
  BYTE *pBVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  U32 maxDist;
  long lVar21;
  ulong uVar22;
  BYTE *pBVar23;
  ulong *puVar24;
  BYTE *pBVar25;
  U32 UVar26;
  ulong uVar27;
  ulong uVar28;
  ulong *puVar29;
  long lVar30;
  ulong uVar31;
  BYTE *len;
  ulong uVar32;
  ulong *puVar33;
  ulong uVar34;
  ulong *src_00;
  ulong uVar35;
  ulong uVar36;
  ldmMatchCandidate_t *plVar37;
  uint uVar38;
  ulong uVar39;
  ldmEntry_t *plVar40;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  ldmRollingHashState_t hashState;
  BYTE *local_1a8;
  uint local_19c;
  rawSeqStore_t *local_198;
  BYTE *local_190;
  ulong local_188;
  BYTE *local_180;
  size_t local_178;
  ulong local_170;
  ldmMatchCandidate_t *local_168;
  ulong *local_160;
  ldmState_t *local_158;
  BYTE *local_150;
  BYTE *local_148;
  uint local_13c;
  BYTE *local_138;
  long local_130;
  ulong *local_128;
  BYTE *local_120;
  BYTE *local_118;
  ldmEntry_t *local_110;
  size_t *local_108;
  ulong local_100;
  BYTE *local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong *local_d8;
  BYTE *local_d0;
  ulong *local_c8;
  void *local_c0;
  size_t local_b8;
  ulong local_b0;
  long local_a8;
  BYTE *local_a0;
  long local_98;
  BYTE *local_90;
  BYTE *local_88;
  long local_80;
  ulong *local_78;
  BYTE *local_70;
  ulong *local_68;
  ulong *local_60;
  ulong local_58;
  BYTE *local_50;
  BYTE *local_48;
  ldmRollingHashState_t local_40;
  
  maxDist = 1 << ((byte)params->windowLog & 0x1f);
  local_c8 = (ulong *)((long)src + srcSize);
  local_130 = ((srcSize >> 0x14) + 1) - (ulong)((srcSize & 0xfffff) == 0);
  local_c0 = src;
  local_b8 = srcSize;
  if ((ldmState->window).nextSrc < local_c8) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e57,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->size < sequences->pos) {
    __assert_fail("sequences->pos <= sequences->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e5b,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->capacity < sequences->size) {
    __assert_fail("sequences->size <= sequences->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e5c,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (local_130 != 0) {
    local_108 = ldmState->splitIndices;
    plVar37 = ldmState->matchCandidates;
    local_a8 = 0;
    local_180 = (BYTE *)0x0;
    local_198 = sequences;
    local_168 = plVar37;
    local_158 = ldmState;
    do {
      local_b0 = sequences->size;
      if (sequences->capacity <= local_b0) {
        return 0;
      }
      src_00 = (ulong *)((long)local_c0 + local_a8 * 0x100000);
      puVar33 = src_00 + 0x20000;
      if (local_b8 + local_a8 * -0x100000 < 0x100000) {
        puVar33 = local_c8;
      }
      if ((long)local_b8 <= local_a8 * 0x100000) {
        __assert_fail("chunkStart < iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7e66,
                      "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                     );
      }
      if (0xe0000000 < (uint)((int)puVar33 - *(int *)&(ldmState->window).base)) {
        UVar9 = params->hashLog;
        UVar10 = ZSTD_window_correctOverflow(&ldmState->window,0,maxDist,src_00);
        plVar4 = ldmState->hashTable;
        lVar21 = 0;
        do {
          uVar11 = plVar4[lVar21].offset;
          UVar26 = uVar11 - UVar10;
          if (uVar11 < UVar10) {
            UVar26 = 0;
          }
          plVar4[lVar21].offset = UVar26;
          lVar21 = lVar21 + 1;
        } while (1L << ((byte)UVar9 & 0x3f) != lVar21);
        ldmState->loadedDictEnd = 0;
        sequences = local_198;
      }
      pBVar13 = (ldmState->window).base;
      uVar11 = (int)puVar33 - (int)pBVar13;
      if (ldmState->loadedDictEnd + maxDist < uVar11) {
        uVar11 = uVar11 - maxDist;
        if ((ldmState->window).lowLimit < uVar11) {
          (ldmState->window).lowLimit = uVar11;
        }
        uVar11 = (ldmState->window).lowLimit;
        if ((ldmState->window).dictLimit < uVar11) {
          (ldmState->window).dictLimit = uVar11;
        }
        ldmState->loadedDictEnd = 0;
      }
      uVar11 = (ldmState->window).dictLimit;
      uVar35 = (ulong)uVar11;
      uVar2 = (ldmState->window).lowLimit;
      bVar16 = (byte)params->bucketSizeLog;
      local_80 = 1L << (bVar16 & 0x3f);
      uVar3 = params->minMatchLength;
      if (uVar2 < uVar11) {
        local_48 = (ldmState->window).dictBase;
        uVar8 = uVar2;
      }
      else {
        local_48 = (BYTE *)0x0;
        uVar8 = uVar11;
      }
      pBVar25 = (BYTE *)((long)puVar33 - (long)src_00);
      local_150 = local_48 + uVar35;
      local_70 = local_48 + uVar8;
      if (uVar11 <= uVar2) {
        local_150 = (BYTE *)0x0;
        local_70 = (BYTE *)0x0;
      }
      len = (BYTE *)(ulong)uVar3;
      pBVar20 = pBVar25;
      if (len <= pBVar25) {
        uVar11 = 0x40;
        if (uVar3 < 0x40) {
          uVar11 = uVar3;
        }
        bVar17 = (byte)params->hashRateLog;
        local_40.rolling = 0xffffffff;
        local_40.stopMask = ~(-1L << (bVar17 & 0x3f));
        if (params->hashRateLog - 1 < uVar11) {
          local_40.stopMask = local_40.stopMask << ((char)uVar11 - bVar17 & 0x3f);
        }
        local_148 = pBVar13 + uVar35;
        local_50 = (BYTE *)((long)src_00 + (long)pBVar25);
        local_a0 = (BYTE *)((long)src_00 + (long)(pBVar25 + -8));
        local_1a8 = (BYTE *)((long)src_00 + (long)len);
        local_100 = -(long)len;
        local_13c = ~(-1 << ((char)params->hashLog - bVar16 & 0x1f));
        local_d8 = (ulong *)(local_50 + -7);
        local_60 = (ulong *)(local_50 + -3);
        local_68 = (ulong *)(local_50 + -1);
        local_88 = pBVar13 + -1;
        local_90 = local_150 + -1;
        local_190 = pBVar13;
        local_188 = uVar35;
        local_138 = pBVar25;
        local_128 = puVar33;
        do {
          if (local_a0 <= local_1a8) {
            pBVar25 = (BYTE *)((long)local_128 - (long)src_00);
            pBVar20 = local_138;
            sequences = local_198;
            goto LAB_0017577a;
          }
          local_19c = 0;
          local_178 = ZSTD_ldm_gear_feed(&local_40,local_1a8,(long)local_a0 - (long)local_1a8,
                                         local_108,&local_19c);
          local_f0 = (ulong)local_19c;
          if (local_f0 != 0) {
            uVar39 = 0;
            do {
              sVar5 = local_108[uVar39];
              lVar21 = local_100 + sVar5;
              lVar30 = 0x27d4eb2f165667c5;
              uVar18 = local_100;
              pBVar13 = local_1a8 + lVar21;
              if (0x1f < uVar3) {
                lVar30 = 0x60ea27eeadc0b5d6;
                uVar34 = 0xc2b2ae3d27d4eb4f;
                uVar18 = 0;
                uVar32 = 0x61c8864e7a143579;
                uVar35 = local_100;
                do {
                  uVar27 = *(long *)(local_1a8 + uVar35 + sVar5) * -0x3d4d51c2d82b14b1 + lVar30;
                  uVar28 = uVar27 * 0x80000000 | uVar27 >> 0x21;
                  lVar30 = uVar28 * -0x61c8864e7a143579;
                  uVar34 = *(long *)(local_1a8 + uVar35 + sVar5 + 8) * -0x3d4d51c2d82b14b1 + uVar34;
                  uVar22 = uVar34 * 0x80000000 | uVar34 >> 0x21;
                  uVar18 = *(long *)(local_1a8 + uVar35 + sVar5 + 0x10) * -0x3d4d51c2d82b14b1 +
                           uVar18;
                  uVar27 = uVar18 * 0x80000000 | uVar18 >> 0x21;
                  uVar34 = uVar22 * -0x61c8864e7a143579;
                  uVar18 = uVar27 * -0x61c8864e7a143579;
                  uVar32 = *(long *)(local_1a8 + uVar35 + sVar5 + 0x18) * -0x3d4d51c2d82b14b1 +
                           uVar32;
                  uVar31 = uVar32 * 0x80000000 | uVar32 >> 0x21;
                  uVar32 = uVar31 * -0x61c8864e7a143579;
                  uVar36 = uVar35 + 0x20;
                  bVar7 = (long)uVar35 < -0x3f;
                  uVar35 = uVar36;
                } while (bVar7);
                pBVar13 = local_1a8 + uVar36 + sVar5;
                uVar18 = ((uVar27 * -0x784349ab80000000 | uVar27 * -0x210ca4fef0869357 >> 0x21) *
                          -0x61c8864e7a143579 ^
                         ((uVar22 * -0x784349ab80000000 | uVar22 * -0x210ca4fef0869357 >> 0x21) *
                          -0x61c8864e7a143579 ^
                         ((uVar28 * -0x784349ab80000000 | uVar28 * -0x210ca4fef0869357 >> 0x21) *
                          -0x61c8864e7a143579 ^
                         (uVar31 * -0x1939e850d5e40000 | uVar32 >> 0x2e) +
                         (uVar27 * 0x779b185ebca87000 | uVar18 >> 0x34) +
                         (uVar22 * 0x1bbcd8c2f5e54380 | uVar34 >> 0x39) +
                         (uVar28 * 0x3c6ef3630bd7950e | (ulong)(lVar30 < 0))) * -0x61c8864e7a143579
                         + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
                         -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
                lVar30 = ((uVar31 * -0x784349ab80000000 | uVar31 * -0x210ca4fef0869357 >> 0x21) *
                          -0x61c8864e7a143579 ^ uVar18) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
                plVar37 = local_168;
                uVar35 = local_188;
              }
              xVar14 = XXH64_finalize((xxh_u64)(len + lVar30),pBVar13,(size_t)len,
                                      (XXH_alignment)uVar18);
              uVar11 = (uint)xVar14 & local_13c;
              plVar37[uVar39].split = local_1a8 + lVar21;
              plVar37[uVar39].hash = uVar11;
              plVar37[uVar39].checksum = (U32)(xVar14 >> 0x20);
              plVar37[uVar39].bucket =
                   local_158->hashTable + ((ulong)uVar11 << ((byte)params->bucketSizeLog & 0x3f));
              uVar39 = uVar39 + 1;
            } while (uVar39 != local_f0);
            local_98 = -local_178;
            uVar39 = 0;
            pBVar13 = local_190;
            ldmState = local_158;
            do {
              puVar33 = (ulong *)plVar37[uVar39].split;
              uVar18 = (ulong)plVar37[uVar39].checksum;
              uVar34 = (ulong)plVar37[uVar39].hash;
              local_58 = uVar39;
              if (puVar33 < src_00) {
                bVar16 = (byte)params->bucketSizeLog;
                pBVar20 = ldmState->bucketOffsets;
                bVar17 = pBVar20[uVar34];
                ldmState->hashTable[(uVar34 << (bVar16 & 0x3f)) + (ulong)bVar17] =
                     (ldmEntry_t)((long)puVar33 - (long)pBVar13 & 0xffffffffU | uVar18 << 0x20);
                pBVar20[uVar34] = ~(byte)(-1 << (bVar16 & 0x1f)) & bVar17 + 1;
                iVar12 = 9;
LAB_001755d6:
                bVar7 = false;
              }
              else {
                plVar40 = plVar37[uVar39].bucket;
                plVar4 = plVar40 + local_80;
                local_78 = puVar33 + 1;
                local_160 = (ulong *)((long)puVar33 + -1);
                local_118 = (BYTE *)0x0;
                local_120 = (BYTE *)0x0;
                pBVar20 = (BYTE *)0x0;
                local_110 = (ldmEntry_t *)0x0;
                local_170 = (long)puVar33 - (long)pBVar13;
                local_e8 = uVar18;
                local_e0 = uVar34;
                do {
                  if (plVar40->checksum == (U32)uVar18) {
                    uVar11 = plVar40->offset;
                    if (uVar8 < uVar11) {
                      uVar38 = (uint)uVar35;
                      if (uVar2 < uVar38) {
                        pBVar15 = local_50;
                        pBVar23 = pBVar13;
                        if (uVar11 < uVar38) {
                          pBVar15 = local_150;
                          pBVar23 = local_48;
                        }
                        local_f8 = pBVar23 + uVar11;
                        pBVar15 = (BYTE *)ZSTD_count_2segments
                                                    ((BYTE *)puVar33,local_f8,local_50,pBVar15,
                                                     local_148);
                        pBVar13 = local_190;
                        uVar35 = local_188;
                        uVar18 = local_e8;
                        uVar34 = local_e0;
                        if (len <= pBVar15) {
                          pBVar19 = local_148;
                          if (uVar11 < (uint)local_188) {
                            pBVar19 = local_70;
                          }
                          if (src_00 < puVar33) {
                            pBVar25 = (BYTE *)0x0;
                            if (pBVar19 < local_f8) {
                              pBVar23 = pBVar23 + uVar11;
                              pBVar25 = (BYTE *)0x0;
                              puVar29 = local_160;
                              do {
                                pBVar23 = pBVar23 + -1;
                                if (((BYTE)*puVar29 != *pBVar23) ||
                                   (pBVar25 = pBVar25 + 1, puVar29 <= src_00)) break;
                                puVar29 = (ulong *)((long)puVar29 + -1);
                              } while (pBVar19 < pBVar23);
                            }
                          }
                          else {
                            pBVar25 = (BYTE *)0x0;
                          }
                          if ((pBVar19 != local_70) && (local_f8 + -(long)pBVar25 == pBVar19)) {
                            if (local_70 < local_150) {
                              lVar21 = 0;
                              if (src_00 < (ulong *)((long)puVar33 + -(long)pBVar25)) {
                                puVar29 = (ulong *)(-(long)pBVar25 + (long)local_160);
                                lVar21 = 0;
                                pBVar23 = local_90;
                                do {
                                  if (((BYTE)*puVar29 != *pBVar23) ||
                                     (lVar21 = lVar21 + 1, puVar29 <= src_00)) break;
                                  puVar29 = (ulong *)((long)puVar29 + -1);
                                  bVar7 = local_70 < pBVar23;
                                  pBVar23 = pBVar23 + -1;
                                } while (bVar7);
                              }
                            }
                            else {
                              lVar21 = 0;
                            }
                            pBVar25 = pBVar25 + lVar21;
                          }
                        }
                      }
                      else {
                        puVar29 = (ulong *)(pBVar13 + uVar11);
                        puVar24 = puVar33;
                        if (puVar33 < local_d8) {
                          uVar18 = *puVar33 ^ *puVar29;
                          uVar39 = 0;
                          if (uVar18 != 0) {
                            for (; (uVar18 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                            }
                          }
                          pBVar15 = (BYTE *)(uVar39 >> 3 & 0x1fffffff);
                          puVar24 = local_78;
                          if (*puVar29 == *puVar33) {
                            do {
                              puVar29 = puVar29 + 1;
                              if (local_d8 <= puVar24) goto LAB_00175405;
                              uVar39 = *puVar24;
                              uVar34 = uVar39 ^ *puVar29;
                              uVar18 = 0;
                              if (uVar34 != 0) {
                                for (; (uVar34 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                                }
                              }
                              pBVar15 = (BYTE *)((long)puVar24 +
                                                ((uVar18 >> 3 & 0x1fffffff) - (long)puVar33));
                              puVar24 = puVar24 + 1;
                            } while (*puVar29 == uVar39);
                          }
                        }
                        else {
LAB_00175405:
                          if ((puVar24 < local_60) && ((int)*puVar29 == (int)*puVar24)) {
                            puVar24 = (ulong *)((long)puVar24 + 4);
                            puVar29 = (ulong *)((long)puVar29 + 4);
                          }
                          if ((puVar24 < local_68) && ((short)*puVar29 == (short)*puVar24)) {
                            puVar24 = (ulong *)((long)puVar24 + 2);
                            puVar29 = (ulong *)((long)puVar29 + 2);
                          }
                          if (puVar24 < local_128) {
                            puVar24 = (ulong *)((long)puVar24 +
                                               (ulong)((BYTE)*puVar29 == (BYTE)*puVar24));
                          }
                          pBVar15 = (BYTE *)((long)puVar24 - (long)puVar33);
                        }
                        uVar18 = local_e8;
                        uVar34 = local_e0;
                        if (len <= pBVar15) {
                          if (src_00 < puVar33) {
                            pBVar25 = (BYTE *)0x0;
                            if (uVar38 < uVar11) {
                              pBVar25 = (BYTE *)0x0;
                              puVar29 = local_160;
                              pBVar23 = local_88 + uVar11;
                              do {
                                if (((BYTE)*puVar29 != *pBVar23) ||
                                   (pBVar25 = pBVar25 + 1, puVar29 <= src_00)) break;
                                puVar29 = (ulong *)((long)puVar29 + -1);
                                bVar7 = local_148 < pBVar23;
                                pBVar23 = pBVar23 + -1;
                              } while (bVar7);
                            }
                          }
                          else {
                            pBVar25 = (BYTE *)0x0;
                          }
                        }
                      }
                      local_e8 = uVar18;
                      local_e0 = uVar34;
                      if ((len <= pBVar15) && (pBVar20 < pBVar25 + (long)pBVar15)) {
                        pBVar20 = pBVar25 + (long)pBVar15;
                        local_120 = pBVar25;
                        local_118 = pBVar15;
                        local_110 = plVar40;
                      }
                    }
                  }
                  plVar40 = plVar40 + 1;
                } while (plVar40 < plVar4);
                plVar37 = local_168;
                ldmState = local_158;
                if (local_110 == (ldmEntry_t *)0x0) {
                  bVar16 = (byte)params->bucketSizeLog;
                  pBVar20 = local_158->bucketOffsets;
                  bVar17 = pBVar20[uVar34];
                  local_158->hashTable[(uVar34 << (bVar16 & 0x3f)) + (ulong)bVar17] =
                       (ldmEntry_t)(local_170 & 0xffffffff | uVar18 << 0x20);
                  pBVar20[uVar34] = ~(byte)(-1 << (bVar16 & 0x1f)) & bVar17 + 1;
                  iVar12 = 9;
                  bVar7 = false;
                }
                else {
                  sVar5 = local_198->size;
                  iVar12 = 0;
                  if (sVar5 == local_198->capacity) {
                    iVar12 = 1;
                    goto LAB_001755d6;
                  }
                  prVar6 = local_198->seq;
                  UVar9 = local_110->offset;
                  prVar6[sVar5].litLength = ((int)puVar33 - (int)local_120) - (int)src_00;
                  prVar6[sVar5].matchLength = (int)local_118 + (int)local_120;
                  prVar6[sVar5].offset = (int)local_170 - UVar9;
                  local_198->size = sVar5 + 1;
                  bVar16 = (byte)params->bucketSizeLog;
                  pBVar13 = local_158->bucketOffsets;
                  bVar17 = pBVar13[uVar34];
                  local_158->hashTable[(uVar34 << (bVar16 & 0x3f)) + (ulong)bVar17] =
                       (ldmEntry_t)(local_170 & 0xffffffff | uVar18 << 0x20);
                  pBVar13[uVar34] = ~(byte)(-1 << (bVar16 & 0x1f)) & bVar17 + 1;
                  src_00 = (ulong *)((long)puVar33 + (long)local_118);
                  bVar7 = src_00 <= local_1a8 + local_178;
                  pBVar13 = local_190;
                  uVar35 = local_188;
                  if (!bVar7) {
                    local_1a8 = (BYTE *)(local_98 + (long)src_00);
                    iVar12 = 7;
                  }
                }
              }
              if ((iVar12 != 0) && (iVar12 != 9)) {
                if (iVar12 != 7) goto LAB_00175746;
                break;
              }
              uVar39 = local_58 + 1;
            } while (uVar39 != local_f0);
          }
          local_1a8 = local_1a8 + local_178;
          bVar7 = true;
LAB_00175746:
        } while (bVar7);
        pBVar25 = (BYTE *)0xffffffffffffffba;
        pBVar20 = local_138;
        sequences = local_198;
      }
LAB_0017577a:
      pBVar13 = pBVar25;
      if (pBVar25 < (BYTE *)0xffffffffffffff89) {
        pBVar13 = local_d0;
        if (local_b0 < sequences->size) {
          pUVar1 = &sequences->seq[local_b0].litLength;
          *pUVar1 = *pUVar1 + (int)local_180;
          local_180 = pBVar25;
        }
        else {
          if (pBVar25 != pBVar20) {
            __assert_fail("newLeftoverSize == chunkSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x7e8d,
                          "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                         );
          }
          local_180 = local_180 + (long)pBVar20;
        }
      }
      local_d0 = pBVar13;
      if ((BYTE *)0xffffffffffffff88 < pBVar25) {
        return (size_t)local_d0;
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != local_130);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, 0, maxDist, ldmState->loadedDictEnd, chunkStart, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
            /* invalidate dictionaries on overflow correction */
            ldmState->loadedDictEnd = 0;
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         offset against maxDist directly.
         *
         * NOTE: Because of dictionaries + sequence splitting we MUST make sure
         * that any offset used is valid at the END of the sequence, since it may
         * be split into two sequences. This condition holds when using
         * ZSTD_window_enforceMaxDist(), but if we move to checking offsets
         * against maxDist directly, we'll have to carefully handle that case.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}